

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testReadMeta(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *file;
  ostream *this;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  float dlev;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  int zlev;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  void *udata;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  int partidx;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_attribute_t *attr;
  exr_attribute_t *newattr;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  uint uVar5;
  char *in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  allocator<char> *in_stack_fffffffffffffb10;
  char *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  float local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  long local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  undefined1 local_dc [4];
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10 [2];
  
  uVar5 = (uint)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::operator+=(local_30,"v1.7.test.1.exr");
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  uVar2 = std::__cxx11::string::c_str();
  local_cc = exr_test_file_header(uVar2,&local_b8);
  if (local_cc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  uVar2 = std::__cxx11::string::c_str();
  local_d0 = exr_start_read(local_10,uVar2,&local_b8);
  if (local_d0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_d4 = exr_attr_declare_by_type(local_10[0],0,"foo","box2i",local_c0);
  if (local_d4 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_d8 = exr_attr_declare(local_10[0],0,"bar",1,local_c0);
  if (local_d8 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_e0 = exr_add_part(local_10[0],"beauty",1,local_dc);
  if (local_e0 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_e4 = exr_set_longname_support(local_10[0],0);
  if (local_e4 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_e8 = exr_set_longname_support(local_10[0],1);
  if (local_e8 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_f0 = 3;
  local_f4 = exr_get_user_data(0,&local_f0);
  if (local_f4 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_f4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_f8 = exr_get_user_data(local_10[0],0);
  if (local_f8 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_f8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_f0 = 3;
  local_fc = exr_get_user_data(local_10[0],&local_f0);
  if (local_fc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_fc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_fc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  if (local_f0 != 0) {
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_100 = -2;
  local_104 = exr_get_zip_compression_level(local_10[0],0,&local_100);
  if (local_104 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_104);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  if (local_100 != -1) {
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_108 = exr_set_zip_compression_level(local_10[0],0,4);
  if (local_108 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_108);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_108);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  local_10c = -3.0;
  iVar1 = exr_get_dwa_compression_level(local_10[0],0,&local_10c);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  if ((local_10c != 45.0) || (NAN(local_10c))) {
    core_test_fail(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,uVar5,
                   in_stack_fffffffffffffad8);
  }
  iVar1 = exr_set_dwa_compression_level(0x42280000,local_10[0],0);
  if (iVar1 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    file = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(8);
    this = std::operator<<(file,pcVar4);
    uVar5 = (uint)((ulong)pcVar4 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,(char *)file,uVar5,(char *)this);
  }
  exr_finish(local_10);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testReadMeta (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;
    exr_attribute_t*       newattr;
    const exr_attribute_t* attr;

    EXRCORE_TEST_RVAL (exr_test_file_header (fn.c_str (), &cinit));
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_attr_declare_by_type (f, 0, "foo", "box2i", &newattr));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_attr_declare (f, 0, "bar", EXR_ATTR_BOX2I, &newattr));

    int partidx;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_add_part (f, "beauty", EXR_STORAGE_TILED, &partidx));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_longname_support (f, 0));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_longname_support (f, 1));

    void* udata = (void*) 3;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_user_data (NULL, &udata));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_user_data (f, NULL));
    udata = (void*) 3;
    EXRCORE_TEST_RVAL (exr_get_user_data (f, &udata));
    EXRCORE_TEST (udata == NULL);

    int zlev = -2;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, 0, &zlev));
    EXRCORE_TEST (zlev == -1);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_zip_compression_level (f, 0, 4));

    float dlev = -3.f;
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (f, 0, &dlev));
    EXRCORE_TEST (dlev == 45.f);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_dwa_compression_level (f, 0, 42.f));

    exr_finish (&f);
}